

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lights.cpp
# Opt level: O1

LightHandle __thiscall
pbrt::LightHandle::Create
          (LightHandle *this,string *name,ParameterDictionary *parameters,Transform *renderFromLight
          ,CameraTransform *cameraTransform,MediumHandle *outsideMedium,FileLoc *loc,Allocator alloc
          )

{
  anon_union_16_1_a7e8d694_for_InlinedVector<int,_4,_pstd::pmr::polymorphic_allocator<int>_>_5
  *paVar1;
  undefined1 auVar2 [16];
  float __x;
  undefined8 uVar3;
  bool bVar4;
  undefined1 auVar5 [16];
  int iVar6;
  int iVar7;
  uintptr_t iptr_1;
  undefined4 extraout_var;
  PointLight *pPVar8;
  GoniometricLight *pGVar9;
  ProjectionLight *pPVar10;
  DistantLight *pDVar11;
  UniformInfiniteLight *pUVar12;
  RGBColorSpace *pRVar13;
  InlinedVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_4,_pstd::pmr::polymorphic_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *pIVar14;
  ImageInfiniteLight *p;
  undefined4 extraout_var_01;
  Transform *loc_00;
  uint uVar15;
  uintptr_t iptr;
  DenselySampledSpectrum *pDVar16;
  pointer p_00;
  char *pcVar17;
  CameraTransform *loc_01;
  ulong uVar18;
  _Alloc_hider _Var19;
  long lVar20;
  ulong uVar21;
  Float FVar22;
  Float FVar23;
  undefined4 extraout_XMM0_Db;
  undefined4 extraout_XMM0_Dc;
  undefined4 extraout_XMM0_Dd;
  undefined1 auVar24 [64];
  undefined1 auVar25 [64];
  undefined1 auVar26 [56];
  undefined1 auVar27 [16];
  span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  requestedChannels;
  Point3f PVar28;
  Float local_4bc;
  Allocator alloc_local;
  float local_4ac;
  RGBColorSpace *colorSpace;
  Float local_47c;
  Float local_478;
  Float local_474;
  vector<pbrt::Point3<float>,_std::allocator<pbrt::Point3<float>_>_> portal;
  string filename;
  vector<pbrt::SpectrumHandle,_std::allocator<pbrt::SpectrumHandle>_> L;
  undefined1 local_408 [16];
  ImageChannelDesc channelDesc;
  SpectrumHandle local_3a0;
  ColorEncodingHandle local_398;
  TaggedPointer<pbrt::ConstantSpectrum,_pbrt::DenselySampledSpectrum,_pbrt::PiecewiseLinearSpectrum,_pbrt::RGBSpectrum,_pbrt::RGBReflectanceSpectrum,_pbrt::BlackbodySpectrum>
  local_390;
  SpectrumHandle local_388;
  TaggedPointer<pbrt::HomogeneousMedium,_pbrt::GeneralMedium<pbrt::UniformGridMediumProvider>,_pbrt::GeneralMedium<pbrt::CloudMediumProvider>,_pbrt::GeneralMedium<pbrt::NanoVDBMediumProvider>_>
  local_380;
  TaggedPointer<pbrt::HomogeneousMedium,_pbrt::GeneralMedium<pbrt::UniformGridMediumProvider>,_pbrt::GeneralMedium<pbrt::CloudMediumProvider>,_pbrt::GeneralMedium<pbrt::NanoVDBMediumProvider>_>
  local_378;
  TaggedPointer<pbrt::HomogeneousMedium,_pbrt::GeneralMedium<pbrt::UniformGridMediumProvider>,_pbrt::GeneralMedium<pbrt::CloudMediumProvider>,_pbrt::GeneralMedium<pbrt::NanoVDBMediumProvider>_>
  local_370;
  TaggedPointer<pbrt::HomogeneousMedium,_pbrt::GeneralMedium<pbrt::UniformGridMediumProvider>,_pbrt::GeneralMedium<pbrt::CloudMediumProvider>,_pbrt::GeneralMedium<pbrt::NanoVDBMediumProvider>_>
  local_368;
  Image image;
  ImageAndMetadata imageAndMetadata;
  undefined4 extraout_var_00;
  undefined1 extraout_var_02 [60];
  
  alloc_local = alloc;
  (this->
  super_TaggedPointer<pbrt::PointLight,_pbrt::DistantLight,_pbrt::ProjectionLight,_pbrt::GoniometricLight,_pbrt::SpotLight,_pbrt::DiffuseAreaLight,_pbrt::UniformInfiniteLight,_pbrt::ImageInfiniteLight,_pbrt::PortalImageInfiniteLight>
  ).bits = 0;
  loc_00 = renderFromLight;
  loc_01 = cameraTransform;
  iVar7 = std::__cxx11::string::compare((char *)name);
  if (iVar7 == 0) {
    local_368.bits =
         (outsideMedium->
         super_TaggedPointer<pbrt::HomogeneousMedium,_pbrt::GeneralMedium<pbrt::UniformGridMediumProvider>,_pbrt::GeneralMedium<pbrt::CloudMediumProvider>,_pbrt::GeneralMedium<pbrt::NanoVDBMediumProvider>_>
         ).bits;
    pPVar8 = PointLight::Create(renderFromLight,(MediumHandle *)&local_368,parameters,
                                parameters->colorSpace,(FileLoc *)loc_01,alloc_local);
    (this->
    super_TaggedPointer<pbrt::PointLight,_pbrt::DistantLight,_pbrt::ProjectionLight,_pbrt::GoniometricLight,_pbrt::SpotLight,_pbrt::DiffuseAreaLight,_pbrt::UniformInfiniteLight,_pbrt::ImageInfiniteLight,_pbrt::PortalImageInfiniteLight>
    ).bits = (ulong)pPVar8 | 0x1000000000000;
  }
  else {
    iVar7 = std::__cxx11::string::compare((char *)name);
    if (iVar7 == 0) {
      local_370.bits =
           (outsideMedium->
           super_TaggedPointer<pbrt::HomogeneousMedium,_pbrt::GeneralMedium<pbrt::UniformGridMediumProvider>,_pbrt::GeneralMedium<pbrt::CloudMediumProvider>,_pbrt::GeneralMedium<pbrt::NanoVDBMediumProvider>_>
           ).bits;
      pPVar10 = (ProjectionLight *)
                SpotLight::Create(renderFromLight,(MediumHandle *)&local_370,parameters,
                                  parameters->colorSpace,(FileLoc *)loc_01,alloc_local);
      uVar18 = 0x5000000000000;
LAB_003385fd:
      (this->
      super_TaggedPointer<pbrt::PointLight,_pbrt::DistantLight,_pbrt::ProjectionLight,_pbrt::GoniometricLight,_pbrt::SpotLight,_pbrt::DiffuseAreaLight,_pbrt::UniformInfiniteLight,_pbrt::ImageInfiniteLight,_pbrt::PortalImageInfiniteLight>
      ).bits = uVar18 | (ulong)pPVar10;
    }
    else {
      iVar7 = std::__cxx11::string::compare((char *)name);
      if (iVar7 == 0) {
        local_378.bits =
             (outsideMedium->
             super_TaggedPointer<pbrt::HomogeneousMedium,_pbrt::GeneralMedium<pbrt::UniformGridMediumProvider>,_pbrt::GeneralMedium<pbrt::CloudMediumProvider>,_pbrt::GeneralMedium<pbrt::NanoVDBMediumProvider>_>
             ).bits;
        pGVar9 = GoniometricLight::Create
                           (renderFromLight,(MediumHandle *)&local_378,parameters,
                            parameters->colorSpace,loc,alloc_local);
        uVar18 = (ulong)pGVar9 | 0x4000000000000;
      }
      else {
        iVar7 = std::__cxx11::string::compare((char *)name);
        if (iVar7 == 0) {
          local_380.bits =
               (outsideMedium->
               super_TaggedPointer<pbrt::HomogeneousMedium,_pbrt::GeneralMedium<pbrt::UniformGridMediumProvider>,_pbrt::GeneralMedium<pbrt::CloudMediumProvider>,_pbrt::GeneralMedium<pbrt::NanoVDBMediumProvider>_>
               ).bits;
          pPVar10 = ProjectionLight::Create
                              (renderFromLight,(MediumHandle *)&local_380,parameters,loc,alloc_local
                              );
          uVar18 = 0x3000000000000;
          goto LAB_003385fd;
        }
        iVar7 = std::__cxx11::string::compare((char *)name);
        if (iVar7 != 0) {
          iVar7 = std::__cxx11::string::compare((char *)name);
          if (iVar7 != 0) {
            pcVar17 = "%s: light type unknown.";
            goto LAB_00338c5d;
          }
          pRVar13 = parameters->colorSpace;
          pIVar14 = &imageAndMetadata.image.channelNames;
          imageAndMetadata.image._0_8_ = pIVar14;
          std::__cxx11::string::_M_construct<char_const*>((string *)&imageAndMetadata,"L","");
          ParameterDictionary::GetSpectrumArray
                    (&L,parameters,(string *)&imageAndMetadata,General,alloc_local);
          if ((InlinedVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_4,_pstd::pmr::polymorphic_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)imageAndMetadata.image._0_8_ != pIVar14) {
            operator_delete((void *)imageAndMetadata.image._0_8_,
                            (ulong)((long)&(imageAndMetadata.image.channelNames.alloc.memoryResource
                                           )->_vptr_memory_resource + 1));
          }
          imageAndMetadata.image._0_8_ = pIVar14;
          std::__cxx11::string::_M_construct<char_const*>((string *)&imageAndMetadata,"scale","");
          local_4bc = ParameterDictionary::GetOneFloat(parameters,(string *)&imageAndMetadata,1.0);
          if ((InlinedVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_4,_pstd::pmr::polymorphic_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)imageAndMetadata.image._0_8_ != pIVar14) {
            operator_delete((void *)imageAndMetadata.image._0_8_,
                            (ulong)((long)&(imageAndMetadata.image.channelNames.alloc.memoryResource
                                           )->_vptr_memory_resource + 1));
          }
          imageAndMetadata.image._0_8_ = pIVar14;
          std::__cxx11::string::_M_construct<char_const*>((string *)&imageAndMetadata,"portal","");
          ParameterDictionary::GetPoint3fArray(&portal,parameters,(string *)&imageAndMetadata);
          if ((InlinedVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_4,_pstd::pmr::polymorphic_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)imageAndMetadata.image._0_8_ != pIVar14) {
            operator_delete((void *)imageAndMetadata.image._0_8_,
                            (ulong)((long)&(imageAndMetadata.image.channelNames.alloc.memoryResource
                                           )->_vptr_memory_resource + 1));
          }
          image._0_8_ = &image.channelNames;
          std::__cxx11::string::_M_construct<char_const*>((string *)&image,"filename","");
          paVar1 = &channelDesc.offset.field_2;
          channelDesc.offset.alloc.memoryResource = (memory_resource *)paVar1;
          std::__cxx11::string::_M_construct<char_const*>((string *)&channelDesc,"");
          ParameterDictionary::GetOneString
                    ((string *)&imageAndMetadata,parameters,(string *)&image,(string *)&channelDesc)
          ;
          ResolveFilename(&filename,(string *)&imageAndMetadata);
          if ((InlinedVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_4,_pstd::pmr::polymorphic_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)imageAndMetadata.image._0_8_ != pIVar14) {
            operator_delete((void *)imageAndMetadata.image._0_8_,
                            (ulong)((long)&(imageAndMetadata.image.channelNames.alloc.memoryResource
                                           )->_vptr_memory_resource + 1));
          }
          if ((anon_union_16_1_a7e8d694_for_InlinedVector<int,_4,_pstd::pmr::polymorphic_allocator<int>_>_5
               *)channelDesc.offset.alloc.memoryResource != paVar1) {
            operator_delete(channelDesc.offset.alloc.memoryResource,
                            channelDesc.offset.field_2._0_8_ + 1);
          }
          if ((InlinedVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_4,_pstd::pmr::polymorphic_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)image._0_8_ != &image.channelNames) {
            operator_delete((void *)image._0_8_,
                            (ulong)((long)&(image.channelNames.alloc.memoryResource)->
                                           _vptr_memory_resource + 1));
          }
          imageAndMetadata.image._0_8_ = pIVar14;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&imageAndMetadata,"illuminance","");
          FVar22 = ParameterDictionary::GetOneFloat(parameters,(string *)&imageAndMetadata,-1.0);
          if ((InlinedVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_4,_pstd::pmr::polymorphic_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)imageAndMetadata.image._0_8_ != pIVar14) {
            operator_delete((void *)imageAndMetadata.image._0_8_,
                            (ulong)((long)&(imageAndMetadata.image.channelNames.alloc.memoryResource
                                           )->_vptr_memory_resource + 1));
          }
          if ((L.super__Vector_base<pbrt::SpectrumHandle,_std::allocator<pbrt::SpectrumHandle>_>.
               _M_impl.super__Vector_impl_data._M_start ==
               L.super__Vector_base<pbrt::SpectrumHandle,_std::allocator<pbrt::SpectrumHandle>_>.
               _M_impl.super__Vector_impl_data._M_finish) && (filename._M_string_length == 0)) {
            pDVar16 = &pRVar13->illuminant;
            local_388.
            super_TaggedPointer<pbrt::ConstantSpectrum,_pbrt::DenselySampledSpectrum,_pbrt::PiecewiseLinearSpectrum,_pbrt::RGBSpectrum,_pbrt::RGBReflectanceSpectrum,_pbrt::BlackbodySpectrum>
            .bits = (TaggedPointer<pbrt::ConstantSpectrum,_pbrt::DenselySampledSpectrum,_pbrt::PiecewiseLinearSpectrum,_pbrt::RGBSpectrum,_pbrt::RGBReflectanceSpectrum,_pbrt::BlackbodySpectrum>
                     )((ulong)pDVar16 | 0x2000000000000);
            FVar23 = SpectrumToPhotometric(&local_388);
            uVar3 = vcmpss_avx512f(ZEXT816(0) << 0x40,ZEXT416((uint)FVar22),1);
            bVar4 = (bool)((byte)uVar3 & 1);
            local_4bc = (Float)((uint)bVar4 * (int)((FVar22 / 3.1415927) * (local_4bc / FVar23)) +
                               (uint)!bVar4 * (int)(local_4bc / FVar23));
            imageAndMetadata.image._0_8_ = pDVar16;
            iVar7 = (*(alloc_local.memoryResource)->_vptr_memory_resource[2])
                              (alloc_local.memoryResource,0xd8,8);
            pstd::pmr::polymorphic_allocator<std::byte>::
            construct<pbrt::UniformInfiniteLight,pbrt::Transform_const&,pbrt::DenselySampledSpectrum_const*,float&,pstd::pmr::polymorphic_allocator<std::byte>&>
                      (&alloc_local,(UniformInfiniteLight *)CONCAT44(extraout_var,iVar7),
                       renderFromLight,(DenselySampledSpectrum **)&imageAndMetadata,&local_4bc,
                       &alloc_local);
            (this->
            super_TaggedPointer<pbrt::PointLight,_pbrt::DistantLight,_pbrt::ProjectionLight,_pbrt::GoniometricLight,_pbrt::SpotLight,_pbrt::DiffuseAreaLight,_pbrt::UniformInfiniteLight,_pbrt::ImageInfiniteLight,_pbrt::PortalImageInfiniteLight>
            ).bits = CONCAT44(extraout_var,iVar7) | 0x7000000000000;
          }
          else if (L.super__Vector_base<pbrt::SpectrumHandle,_std::allocator<pbrt::SpectrumHandle>_>
                   ._M_impl.super__Vector_impl_data._M_start ==
                   L.super__Vector_base<pbrt::SpectrumHandle,_std::allocator<pbrt::SpectrumHandle>_>
                   ._M_impl.super__Vector_impl_data._M_finish) {
            local_398.
            super_TaggedPointer<pbrt::LinearColorEncoding,_pbrt::sRGBColorEncoding,_pbrt::GammaColorEncoding>
            .bits = (TaggedPointer<pbrt::LinearColorEncoding,_pbrt::sRGBColorEncoding,_pbrt::GammaColorEncoding>
                     )0;
            Image::Read(&imageAndMetadata,&filename,alloc_local,&local_398);
            colorSpace = ImageMetadata::GetColorSpace(&imageAndMetadata.metadata);
            image._0_8_ = &image.channelNames;
            std::__cxx11::string::_M_construct<char_const*>((string *)&image,"R","");
            image.channelNames.field_2.fixed[0]._M_dataplus._M_p =
                 (_Alloc_hider)((long)&image.channelNames.field_2 + 0x10);
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&image.channelNames.field_2,"G","");
            _Var19._M_p = (pointer)((long)&image.channelNames.field_2 + 0x30);
            image.channelNames.field_2.fixed[1]._M_dataplus._M_p = (_Alloc_hider)_Var19._M_p;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)((long)&image.channelNames.field_2 + 0x20),"B","");
            requestedChannels.n = 3;
            requestedChannels.ptr =
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&image;
            Image::GetChannelDesc(&channelDesc,&imageAndMetadata.image,requestedChannels);
            lVar20 = -0x60;
            do {
              if ((long *)_Var19._M_p != *(long **)((long)_Var19._M_p + -0x10)) {
                operator_delete(*(long **)((long)_Var19._M_p + -0x10),*(long *)_Var19._M_p + 1);
              }
              _Var19._M_p = _Var19._M_p + -0x20;
              lVar20 = lVar20 + 0x20;
            } while (lVar20 != 0);
            if (channelDesc.offset.nStored == 0) {
              ErrorExit<std::__cxx11::string&>
                        (loc,
                         "%s: image provided to \"infinite\" light must have R, G, and B channels.",
                         &filename);
            }
            local_3a0.
            super_TaggedPointer<pbrt::ConstantSpectrum,_pbrt::DenselySampledSpectrum,_pbrt::PiecewiseLinearSpectrum,_pbrt::RGBSpectrum,_pbrt::RGBReflectanceSpectrum,_pbrt::BlackbodySpectrum>
            .bits = (TaggedPointer<pbrt::ConstantSpectrum,_pbrt::DenselySampledSpectrum,_pbrt::PiecewiseLinearSpectrum,_pbrt::RGBSpectrum,_pbrt::RGBReflectanceSpectrum,_pbrt::BlackbodySpectrum>
                     )((ulong)&colorSpace->illuminant | 0x2000000000000);
            FVar23 = SpectrumToPhotometric(&local_3a0);
            iVar6 = imageAndMetadata.image.resolution.super_Tuple2<pbrt::Point2,_int>.y;
            uVar3 = imageAndMetadata.image._0_8_;
            iVar7 = imageAndMetadata.image.resolution.super_Tuple2<pbrt::Point2,_int>.x;
            local_4bc = local_4bc / FVar23;
            auVar24 = ZEXT864(0);
            if (0.0 < FVar22) {
              pRVar13 = ImageMetadata::GetColorSpace(&imageAndMetadata.metadata);
              uVar15 = iVar6 / 2;
              local_4ac = 0.0;
              if (1 < iVar6) {
                local_474 = (pRVar13->XYZFromRGB).m[1][0];
                local_478 = (pRVar13->XYZFromRGB).m[1][1];
                local_47c = (pRVar13->XYZFromRGB).m[1][2];
                local_4ac = 0.0;
                uVar18 = 0;
                do {
                  __x = (((float)(int)uVar18 + 0.5) /
                         (float)imageAndMetadata.image.resolution.super_Tuple2<pbrt::Point2,_int>.y
                        + -0.5) * 3.1415927;
                  local_408._0_4_ = cosf(__x);
                  local_408._4_4_ = extraout_XMM0_Db;
                  local_408._8_4_ = extraout_XMM0_Dc;
                  local_408._12_4_ = extraout_XMM0_Dd;
                  auVar25._0_4_ = sinf(__x);
                  auVar25._4_60_ = extraout_var_02;
                  if (0xffffffff < (long)uVar3) {
                    auVar27._8_4_ = 0x7fffffff;
                    auVar27._0_8_ = 0x7fffffff7fffffff;
                    auVar27._12_4_ = 0x7fffffff;
                    auVar2 = vandps_avx(auVar27,local_408);
                    auVar27 = vandps_avx(auVar25._0_16_,auVar27);
                    uVar21 = 0;
                    do {
                      Image::GetChannels((ImageChannelValues *)&image,&imageAndMetadata.image,
                                         (Point2i)(uVar18 << 0x20 | uVar21),(WrapMode2D)0x200000002)
                      ;
                      pIVar14 = (InlinedVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_4,_pstd::pmr::polymorphic_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 *)image._8_8_;
                      if (image._8_8_ == 0) {
                        pIVar14 = &image.channelNames;
                      }
                      lVar20 = 0;
                      auVar24 = ZEXT464((uint)local_4ac);
                      do {
                        FVar23 = local_474;
                        if (((int)lVar20 != 0) && (FVar23 = local_478, (int)lVar20 != 1)) {
                          FVar23 = local_47c;
                        }
                        auVar5 = vfmadd213ss_fma(ZEXT416((uint)(auVar2._0_4_ *
                                                               FVar23 * *(float *)((long)&(pIVar14->
                                                                                          alloc).
                                                  memoryResource + lVar20 * 4))),auVar27,
                                                 auVar24._0_16_);
                        auVar24 = ZEXT1664(auVar5);
                        lVar20 = lVar20 + 1;
                      } while (lVar20 != 3);
                      local_4ac = auVar5._0_4_;
                      image.channelNames.field_2.fixed[0]._M_string_length = 0;
                      (**(code **)(*(long *)image._0_8_ + 0x18))
                                (image._0_8_,image._8_8_,
                                 (long)image.channelNames.field_2.fixed[0]._M_dataplus._M_p << 2,4);
                      uVar21 = uVar21 + 1;
                    } while (uVar21 != (iVar7 & 0x7fffffff));
                  }
                  uVar18 = uVar18 + 1;
                } while (uVar18 != uVar15);
              }
              local_4bc = (FVar22 / ((local_4ac / ((float)iVar7 * (float)(int)uVar15)) * 9.869605))
                          * local_4bc;
              auVar24 = ZEXT464((uint)local_4bc);
            }
            Image::SelectChannels(&image,&imageAndMetadata.image,&channelDesc,alloc_local);
            p_00 = portal.
                   super__Vector_base<pbrt::Point3<float>,_std::allocator<pbrt::Point3<float>_>_>.
                   _M_impl.super__Vector_impl_data._M_start;
            if (portal.
                super__Vector_base<pbrt::Point3<float>,_std::allocator<pbrt::Point3<float>_>_>.
                _M_impl.super__Vector_impl_data._M_start ==
                portal.
                super__Vector_base<pbrt::Point3<float>,_std::allocator<pbrt::Point3<float>_>_>.
                _M_impl.super__Vector_impl_data._M_finish) {
              iVar7 = (*(alloc_local.memoryResource)->_vptr_memory_resource[2])
                                (alloc_local.memoryResource,0x2f8,8);
              p = (ImageInfiniteLight *)CONCAT44(extraout_var_01,iVar7);
              pstd::pmr::polymorphic_allocator<std::byte>::
              construct<pbrt::ImageInfiniteLight,pbrt::Transform_const&,pbrt::Image,pbrt::RGBColorSpace_const*&,float&,std::__cxx11::string&,pstd::pmr::polymorphic_allocator<std::byte>&>
                        (&alloc_local,p,renderFromLight,&image,&colorSpace,&local_4bc,&filename,
                         &alloc_local);
              uVar18 = 0x8000000000000;
            }
            else {
              do {
                auVar26 = auVar24._8_56_;
                PVar28 = CameraTransform::RenderFromWorld(cameraTransform,p_00);
                auVar24._0_8_ = PVar28.super_Tuple3<pbrt::Point3,_float>._0_8_;
                auVar24._8_56_ = auVar26;
                uVar3 = vmovlps_avx(auVar24._0_16_);
                (p_00->super_Tuple3<pbrt::Point3,_float>).x = (float)(int)uVar3;
                (p_00->super_Tuple3<pbrt::Point3,_float>).y = (float)(int)((ulong)uVar3 >> 0x20);
                (p_00->super_Tuple3<pbrt::Point3,_float>).z =
                     PVar28.super_Tuple3<pbrt::Point3,_float>.z;
                p_00 = p_00 + 1;
              } while (p_00 != portal.
                               super__Vector_base<pbrt::Point3<float>,_std::allocator<pbrt::Point3<float>_>_>
                               ._M_impl.super__Vector_impl_data._M_finish);
              iVar7 = (*(alloc_local.memoryResource)->_vptr_memory_resource[2])
                                (alloc_local.memoryResource,0x280,8);
              p = (ImageInfiniteLight *)CONCAT44(extraout_var_00,iVar7);
              pstd::pmr::polymorphic_allocator<std::byte>::
              construct<pbrt::PortalImageInfiniteLight,pbrt::Transform_const&,pbrt::Image,pbrt::RGBColorSpace_const*&,float&,std::__cxx11::string&,std::vector<pbrt::Point3<float>,std::allocator<pbrt::Point3<float>>>&,pstd::pmr::polymorphic_allocator<std::byte>&>
                        (&alloc_local,(PortalImageInfiniteLight *)p,renderFromLight,&image,
                         &colorSpace,&local_4bc,&filename,&portal,&alloc_local);
              uVar18 = 0x9000000000000;
            }
            (this->
            super_TaggedPointer<pbrt::PointLight,_pbrt::DistantLight,_pbrt::ProjectionLight,_pbrt::GoniometricLight,_pbrt::SpotLight,_pbrt::DiffuseAreaLight,_pbrt::UniformInfiniteLight,_pbrt::ImageInfiniteLight,_pbrt::PortalImageInfiniteLight>
            ).bits = (ulong)p | uVar18;
            Image::~Image(&image);
            InlinedVector<int,_4,_pstd::pmr::polymorphic_allocator<int>_>::~InlinedVector
                      (&channelDesc.offset);
            ImageAndMetadata::~ImageAndMetadata(&imageAndMetadata);
          }
          else {
            if (filename._M_string_length != 0) {
              pcVar17 = "Can\'t specify both emission \"L\" and \"filename\" with InfiniteAreaLight"
              ;
LAB_00338c96:
              ErrorExit(loc,pcVar17);
            }
            if (portal.
                super__Vector_base<pbrt::Point3<float>,_std::allocator<pbrt::Point3<float>_>_>.
                _M_impl.super__Vector_impl_data._M_start !=
                portal.
                super__Vector_base<pbrt::Point3<float>,_std::allocator<pbrt::Point3<float>_>_>.
                _M_impl.super__Vector_impl_data._M_finish) {
              pcVar17 = "Portals are not supported for InfiniteAreaLights without \"filename\".";
              goto LAB_00338c96;
            }
            local_390.bits =
                 ((L.super__Vector_base<pbrt::SpectrumHandle,_std::allocator<pbrt::SpectrumHandle>_>
                   ._M_impl.super__Vector_impl_data._M_start)->
                 super_TaggedPointer<pbrt::ConstantSpectrum,_pbrt::DenselySampledSpectrum,_pbrt::PiecewiseLinearSpectrum,_pbrt::RGBSpectrum,_pbrt::RGBReflectanceSpectrum,_pbrt::BlackbodySpectrum>
                 ).bits;
            FVar23 = SpectrumToPhotometric((SpectrumHandle *)&local_390);
            uVar3 = vcmpss_avx512f(ZEXT816(0) << 0x40,ZEXT416((uint)FVar22),1);
            bVar4 = (bool)((byte)uVar3 & 1);
            local_4bc = (Float)((uint)bVar4 * (int)((FVar22 / 3.1415927) * (local_4bc / FVar23)) +
                               (uint)!bVar4 * (int)(local_4bc / FVar23));
            pUVar12 = pstd::pmr::polymorphic_allocator<std::byte>::
                      new_object<pbrt::UniformInfiniteLight,pbrt::Transform_const&,pbrt::SpectrumHandle&,float&,pstd::pmr::polymorphic_allocator<std::byte>&>
                                (&alloc_local,renderFromLight,
                                 L.
                                 super__Vector_base<pbrt::SpectrumHandle,_std::allocator<pbrt::SpectrumHandle>_>
                                 ._M_impl.super__Vector_impl_data._M_start,&local_4bc,&alloc_local);
            (this->
            super_TaggedPointer<pbrt::PointLight,_pbrt::DistantLight,_pbrt::ProjectionLight,_pbrt::GoniometricLight,_pbrt::SpotLight,_pbrt::DiffuseAreaLight,_pbrt::UniformInfiniteLight,_pbrt::ImageInfiniteLight,_pbrt::PortalImageInfiniteLight>
            ).bits = (ulong)pUVar12 | 0x7000000000000;
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)filename._M_dataplus._M_p != &filename.field_2) {
            operator_delete(filename._M_dataplus._M_p,filename.field_2._M_allocated_capacity + 1);
          }
          if (portal.super__Vector_base<pbrt::Point3<float>,_std::allocator<pbrt::Point3<float>_>_>.
              _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(portal.
                            super__Vector_base<pbrt::Point3<float>,_std::allocator<pbrt::Point3<float>_>_>
                            ._M_impl.super__Vector_impl_data._M_start,
                            (long)portal.
                                  super__Vector_base<pbrt::Point3<float>,_std::allocator<pbrt::Point3<float>_>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage -
                            (long)portal.
                                  super__Vector_base<pbrt::Point3<float>,_std::allocator<pbrt::Point3<float>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start);
          }
          if (L.super__Vector_base<pbrt::SpectrumHandle,_std::allocator<pbrt::SpectrumHandle>_>.
              _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(L.
                            super__Vector_base<pbrt::SpectrumHandle,_std::allocator<pbrt::SpectrumHandle>_>
                            ._M_impl.super__Vector_impl_data._M_start,
                            (long)L.
                                  super__Vector_base<pbrt::SpectrumHandle,_std::allocator<pbrt::SpectrumHandle>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage -
                            (long)L.
                                  super__Vector_base<pbrt::SpectrumHandle,_std::allocator<pbrt::SpectrumHandle>_>
                                  ._M_impl.super__Vector_impl_data._M_start);
          }
          goto LAB_00338c32;
        }
        pDVar11 = DistantLight::Create
                            (renderFromLight,parameters,parameters->colorSpace,(FileLoc *)loc_00,
                             alloc_local);
        uVar18 = (ulong)pDVar11 | 0x2000000000000;
      }
      (this->
      super_TaggedPointer<pbrt::PointLight,_pbrt::DistantLight,_pbrt::ProjectionLight,_pbrt::GoniometricLight,_pbrt::SpotLight,_pbrt::DiffuseAreaLight,_pbrt::UniformInfiniteLight,_pbrt::ImageInfiniteLight,_pbrt::PortalImageInfiniteLight>
      ).bits = uVar18;
    }
  }
LAB_00338c32:
  if (((this->
       super_TaggedPointer<pbrt::PointLight,_pbrt::DistantLight,_pbrt::ProjectionLight,_pbrt::GoniometricLight,_pbrt::SpotLight,_pbrt::DiffuseAreaLight,_pbrt::UniformInfiniteLight,_pbrt::ImageInfiniteLight,_pbrt::PortalImageInfiniteLight>
       ).bits & 0xffffffffffff) != 0) {
    ParameterDictionary::ReportUnused(parameters);
    return (LightHandle)
           (TaggedPointer<pbrt::PointLight,_pbrt::DistantLight,_pbrt::ProjectionLight,_pbrt::GoniometricLight,_pbrt::SpotLight,_pbrt::DiffuseAreaLight,_pbrt::UniformInfiniteLight,_pbrt::ImageInfiniteLight,_pbrt::PortalImageInfiniteLight>
            )this;
  }
  pcVar17 = "%s: unable to create light.";
LAB_00338c5d:
  ErrorExit<std::__cxx11::string_const&>(loc,pcVar17,name);
}

Assistant:

LightHandle LightHandle::Create(const std::string &name,
                                const ParameterDictionary &parameters,
                                const Transform &renderFromLight,
                                const CameraTransform &cameraTransform,
                                MediumHandle outsideMedium, const FileLoc *loc,
                                Allocator alloc) {
    LightHandle light = nullptr;
    if (name == "point")
        light = PointLight::Create(renderFromLight, outsideMedium, parameters,
                                   parameters.ColorSpace(), loc, alloc);
    else if (name == "spot")
        light = SpotLight::Create(renderFromLight, outsideMedium, parameters,
                                  parameters.ColorSpace(), loc, alloc);
    else if (name == "goniometric")
        light = GoniometricLight::Create(renderFromLight, outsideMedium, parameters,
                                         parameters.ColorSpace(), loc, alloc);
    else if (name == "projection")
        light = ProjectionLight::Create(renderFromLight, outsideMedium, parameters, loc,
                                        alloc);
    else if (name == "distant")
        light = DistantLight::Create(renderFromLight, parameters, parameters.ColorSpace(),
                                     loc, alloc);
    else if (name == "infinite") {
        const RGBColorSpace *colorSpace = parameters.ColorSpace();
        std::vector<SpectrumHandle> L =
            parameters.GetSpectrumArray("L", SpectrumType::General, alloc);
        Float scale = parameters.GetOneFloat("scale", 1);
        std::vector<Point3f> portal = parameters.GetPoint3fArray("portal");
        std::string filename = ResolveFilename(parameters.GetOneString("filename", ""));
        Float E_v = parameters.GetOneFloat("illuminance", -1);

        if (L.empty() && filename.empty()) {
            // Scale the light spectrum to be equivalent to 1 nit
            scale /= SpectrumToPhotometric(&colorSpace->illuminant);
            if (E_v > 0) {
                // If the scene specifies desired illuminance, first calculate
                // the illuminance from a uniform hemispherical emission
                // of L_v then use this to scale the emission spectrum.
                Float k_e = Pi;
                scale *= E_v / k_e;
            }

            // Default: color space's std illuminant
            light = alloc.new_object<UniformInfiniteLight>(
                renderFromLight, &colorSpace->illuminant, scale, alloc);
        } else if (!L.empty()) {
            if (!filename.empty())
                ErrorExit(loc, "Can't specify both emission \"L\" and "
                               "\"filename\" with InfiniteAreaLight");

            if (!portal.empty())
                ErrorExit(loc, "Portals are not supported for InfiniteAreaLights "
                               "without \"filename\".");

            // Scale the light spectrum to be equivalent to 1 nit
            scale /= SpectrumToPhotometric(L[0]);

            if (E_v > 0) {
                // If the scene specifies desired illuminance, first calculate
                // the illuminance from a uniform hemispherical emission
                // of L_v then use this to scale the emission spectrum.
                Float k_e = Pi;
                scale *= E_v / k_e;
            }

            light = alloc.new_object<UniformInfiniteLight>(renderFromLight, L[0], scale,
                                                           alloc);
        } else {
            ImageAndMetadata imageAndMetadata = Image::Read(filename, alloc);
            const RGBColorSpace *colorSpace = imageAndMetadata.metadata.GetColorSpace();

            ImageChannelDesc channelDesc =
                imageAndMetadata.image.GetChannelDesc({"R", "G", "B"});
            if (!channelDesc)
                ErrorExit(loc,
                          "%s: image provided to \"infinite\" light must "
                          "have R, G, and B channels.",
                          filename);

            // Scale the light spectrum to be equivalent to 1 nit
            scale /= SpectrumToPhotometric(&colorSpace->illuminant);

            if (E_v > 0) {
                // Upper hemisphere illuminance calculation for converting map to physical
                // units
                float illuminance = 0;
                const Image &image = imageAndMetadata.image;
                int ye = image.Resolution().y / 2;
                int ys = 0;
                int xs = 0;
                int xe = image.Resolution().x;
                RGB lum = imageAndMetadata.metadata.GetColorSpace()->LuminanceVector();
                for (int y = ys; y < ye; ++y) {
                    float v = (float(y) + 0.5f) / float(image.Resolution().y);
                    float theta = (v - 0.5f) * Pi;
                    float cosTheta = std::cos(theta);
                    float sinTheta = std::sin(theta);
                    for (int x = xs; x < xe; ++x) {
                        ImageChannelValues values = image.GetChannels({x, y});
                        for (int c = 0; c < 3; ++c) {
                            illuminance += values[c] * lum[c] * std::abs(cosTheta) *
                                           std::abs(sinTheta);
                        }
                    }
                }
                illuminance /= float(ye - ys) * float(xe - xs);
                illuminance *= Pi * Pi;

                // scaling factor is just the ratio of the target
                // illuminance and the illuminance of the map multiplied by
                // the illuminant spectrum
                Float k_e = illuminance;
                scale *= E_v / k_e;
            }

            Image image = imageAndMetadata.image.SelectChannels(channelDesc, alloc);

            if (!portal.empty()) {
                for (Point3f &p : portal)
                    p = cameraTransform.RenderFromWorld(p);

                light = alloc.new_object<PortalImageInfiniteLight>(
                    renderFromLight, std::move(image), colorSpace, scale, filename,
                    portal, alloc);
            } else
                light = alloc.new_object<ImageInfiniteLight>(renderFromLight,
                                                             std::move(image), colorSpace,
                                                             scale, filename, alloc);
        }
    } else
        ErrorExit(loc, "%s: light type unknown.", name);

    if (!light)
        ErrorExit(loc, "%s: unable to create light.", name);

    parameters.ReportUnused();
    return light;
}